

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_314906::ArgParser::argEncBits(ArgParser *this,string *arg)

{
  bool bVar1;
  int __edflag;
  allocator<char> local_31;
  string local_30;
  
  if ((this->accumulated_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->accumulated_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"positional and dashed encryption arguments may not be mixed",
               &local_31);
    QPDFArgParser::usage(&this->ap,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  bVar1 = std::operator==(arg,"40");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"40-bit encryption",&local_31);
    QPDFArgParser::selectOptionTable(&this->ap,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    __edflag = 0x28;
  }
  else {
    bVar1 = std::operator==(arg,"128");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"128-bit encryption",&local_31);
      QPDFArgParser::selectOptionTable(&this->ap,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      __edflag = 0x80;
    }
    else {
      bVar1 = std::operator==(arg,"256");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"256-bit encryption",&local_31);
        QPDFArgParser::selectOptionTable(&this->ap,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        __edflag = 0x100;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"encryption key length must be 40, 128, or 256",&local_31);
        QPDFArgParser::usage(&this->ap,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        __edflag = 0;
      }
    }
  }
  QPDFJob::Config::encrypt
            ((Config *)&local_30,
             (char *)(this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,__edflag);
  std::__shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
  return;
}

Assistant:

void
ArgParser::argEncBits(std::string const& arg)
{
    if (!accumulated_args.empty()) {
        usage("positional and dashed encryption arguments may not be mixed");
    }
    int keylen = 0;
    if (arg == "40") {
        keylen = 40;
        this->ap.selectOptionTable(O_40_BIT_ENCRYPTION);
    } else if (arg == "128") {
        keylen = 128;
        this->ap.selectOptionTable(O_128_BIT_ENCRYPTION);
    } else if (arg == "256") {
        keylen = 256;
        this->ap.selectOptionTable(O_256_BIT_ENCRYPTION);
    } else {
        usage("encryption key length must be 40, 128, or 256");
    }
    this->c_enc = c_main->encrypt(keylen, user_password, owner_password);
}